

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboTestUtil::FlatColorShader::FlatColorShader
          (FlatColorShader *this,DataType outputType)

{
  ShaderProgramDeclaration *pSVar1;
  char *pcVar2;
  allocator<char> aStack_2c8;
  allocator<char> local_2c7;
  allocator<char> local_2c6;
  allocator<char> local_2c5;
  FragmentOutput local_2c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  FragmentSource local_220;
  string local_200 [32];
  VertexSource local_1e0;
  string local_1c0 [32];
  string local_1a0 [32];
  VertexToFragmentVarying local_180;
  Uniform local_178;
  VertexAttribute local_150;
  ShaderProgramDeclaration local_128;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_128);
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"a_position",&local_2c5);
  std::__cxx11::string::string((string *)&local_150,local_1a0);
  local_150.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_128,&local_150);
  local_180.type = GENERICVECTYPE_FLOAT;
  local_180.flatshade = false;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_180);
  if (outputType == TYPE_FLOAT_VEC4) {
    local_2c4.type = GENERICVECTYPE_FLOAT;
  }
  else if (outputType == TYPE_UINT_VEC4) {
    local_2c4.type = GENERICVECTYPE_UINT32;
  }
  else if (outputType == TYPE_INT_VEC4) {
    local_2c4.type = GENERICVECTYPE_INT32;
  }
  else {
    local_2c4.type = GENERICVECTYPE_LAST;
  }
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2c4);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"u_color",&local_2c6);
  std::__cxx11::string::string((string *)&local_178,local_1c0);
  local_178.type = TYPE_FLOAT_VEC4;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_178);
  std::__cxx11::string::string<std::allocator<char>>
            (local_200,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_2c7);
  std::__cxx11::string::string((string *)&local_1e0,local_200);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,
             "#version 300 es\nuniform highp vec4 u_color;\nlayout(location = 0) out highp ",
             &aStack_2c8);
  pcVar2 = glu::getDataTypeName(outputType);
  std::operator+(&local_2a0,&local_2c0,pcVar2);
  std::operator+(&local_280,&local_2a0," o_color;\nvoid main (void)\n{\n\to_color = ");
  pcVar2 = glu::getDataTypeName(outputType);
  std::operator+(&local_260,&local_280,pcVar2);
  std::operator+(&local_240,&local_260,"(u_color);\n}\n");
  std::__cxx11::string::string((string *)&local_220,(string *)&local_240);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_220);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string(local_1a0);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_128);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_00c263a0;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_00c263d8;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_00c263f0;
  *(DataType *)&(this->super_ShaderProgram).field_0x154 = outputType;
  return;
}

Assistant:

FlatColorShader::FlatColorShader (glu::DataType outputType)
	: ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
					<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
					<< sglr::pdec::FragmentOutput(mapDataTypeToGenericVecType(outputType))
					<< sglr::pdec::Uniform("u_color", glu::TYPE_FLOAT_VEC4)
					<< sglr::pdec::VertexSource(
							"#version 300 es\n"
							"in highp vec4 a_position;\n"
							"void main (void)\n"
							"{\n"
							"	gl_Position = a_position;\n"
							"}\n")
					<< sglr::pdec::FragmentSource(
							string(
								"#version 300 es\n"
								"uniform highp vec4 u_color;\n"
								"layout(location = 0) out highp ") + glu::getDataTypeName(outputType) + " o_color;\n"
								"void main (void)\n"
								"{\n"
								"	o_color = " + glu::getDataTypeName(outputType) + "(u_color);\n"
								"}\n"))
	, m_outputType(outputType)
{
}